

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uncertain_measurements.cpp
# Opt level: O2

void __thiscall
uncertainOps_testHeight_Test::~uncertainOps_testHeight_Test(uncertainOps_testHeight_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(uncertainOps, testHeight)
{
    uncertain_measurement v0(4.0, 0.2, m / s);
    uncertain_measurement t(0.6, 0.06, s);
    measurement gc = 9.8 * m / s.pow(2);

    auto y = v0.simple_product(t).simple_subtract(0.5 * gc * pow(t, 2));

    auto ys = v0 * t - 0.5 * gc * pow(t, 2);

    EXPECT_NEAR(y.uncertainty(), 0.712, 0.005);
    EXPECT_NEAR(y.value(), 0.636, 0.0005);
    EXPECT_EQ(y.units(), m);

    EXPECT_NEAR(ys.uncertainty(), 0.44, 0.005);
    EXPECT_NEAR(ys.value(), 0.636, 0.0005);
    EXPECT_EQ(ys.units(), m);
}